

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O0

Result wabt::ReadBinary(void *data,size_t size,BinaryReaderDelegate *delegate,
                       ReadBinaryOptions *options)

{
  Result RVar1;
  undefined1 local_110 [8];
  BinaryReader reader;
  ReadBinaryOptions *options_local;
  BinaryReaderDelegate *delegate_local;
  size_t size_local;
  void *data_local;
  
  reader._216_8_ = options;
  anon_unknown_19::BinaryReader::BinaryReader((BinaryReader *)local_110,data,size,delegate,options);
  RVar1 = anon_unknown_19::BinaryReader::ReadModule((BinaryReader *)local_110);
  anon_unknown_19::BinaryReader::~BinaryReader((BinaryReader *)local_110);
  return (Result)RVar1.enum_;
}

Assistant:

Result ReadBinary(const void* data,
                  size_t size,
                  BinaryReaderDelegate* delegate,
                  const ReadBinaryOptions& options) {
  BinaryReader reader(data, size, delegate, options);
  return reader.ReadModule();
}